

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btConvexHull.cpp
# Opt level: O1

bool __thiscall
HullLibrary::CleanupVertices
          (HullLibrary *this,uint svcount,btVector3 *svertices,uint stride,uint *vcount,
          btVector3 *vertices,btScalar normalepsilon,btVector3 *scale)

{
  int *piVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  bool bVar4;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  int *piVar8;
  btVector3 *pbVar9;
  btScalar *pbVar10;
  ulong uVar11;
  btVector3 *pbVar12;
  btVector3 *extraout_RDX;
  btVector3 *extraout_RDX_00;
  int iVar13;
  long lVar14;
  uint *puVar15;
  btScalar *pbVar16;
  btVector3 *p_1;
  ulong uVar17;
  ulong uVar18;
  bool bVar19;
  uint uVar20;
  uint uVar21;
  int iVar22;
  float fVar23;
  float fVar24;
  btScalar dist1;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  undefined1 auVar33 [16];
  float fVar34;
  float fVar35;
  undefined1 auVar36 [16];
  float fVar37;
  float fVar38;
  float fVar39;
  btScalar bmax_1 [3];
  btScalar bmin_1 [3];
  btScalar bmax [3];
  btScalar bmin [3];
  float local_d8 [4];
  float local_c8 [4];
  float local_b8 [4];
  float local_a8 [4];
  btVector3 *local_98;
  uint *local_90;
  btScalar local_88;
  btScalar *local_78;
  ulong local_70;
  btScalar local_68;
  btScalar bStack_64;
  btScalar bStack_60;
  btScalar bStack_5c;
  undefined1 local_58 [16];
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  undefined1 auVar32 [16];
  
  if (svcount == 0) goto LAB_00128267;
  iVar5 = (this->m_vertexIndexMapping).m_size;
  lVar14 = (long)iVar5;
  local_98 = vertices;
  local_90 = vcount;
  local_88 = normalepsilon;
  if ((lVar14 < 1) && (iVar5 < 0)) {
    if ((this->m_vertexIndexMapping).m_capacity < 0) {
      piVar8 = (this->m_vertexIndexMapping).m_data;
      if (piVar8 != (int *)0x0) {
        if ((this->m_vertexIndexMapping).m_ownsMemory == true) {
          btAlignedFreeInternal(piVar8);
        }
        (this->m_vertexIndexMapping).m_data = (int *)0x0;
      }
      (this->m_vertexIndexMapping).m_ownsMemory = true;
      (this->m_vertexIndexMapping).m_data = (int *)0x0;
      (this->m_vertexIndexMapping).m_capacity = 0;
    }
    if (iVar5 < 0) {
      memset((this->m_vertexIndexMapping).m_data + lVar14,0,lVar14 * -4);
    }
  }
  iVar5 = 0;
  (this->m_vertexIndexMapping).m_size = 0;
  *local_90 = 0;
  scale->m_floats[0] = 1.0;
  scale->m_floats[1] = 1.0;
  scale->m_floats[2] = 1.0;
  local_a8[0] = 3.4028235e+38;
  local_a8[1] = 3.4028235e+38;
  local_a8[2] = 3.4028235e+38;
  local_b8[0] = -3.4028235e+38;
  local_b8[1] = -3.4028235e+38;
  local_b8[2] = -3.4028235e+38;
  uVar11 = (ulong)stride;
  pbVar12 = svertices;
  do {
    lVar14 = 0;
    do {
      fVar38 = pbVar12->m_floats[lVar14];
      if (fVar38 < local_a8[lVar14]) {
        local_a8[lVar14] = fVar38;
      }
      if (local_b8[lVar14] <= fVar38 && fVar38 != local_b8[lVar14]) {
        local_b8[lVar14] = fVar38;
      }
      lVar14 = lVar14 + 1;
    } while (lVar14 != 3);
    pbVar12 = (btVector3 *)((long)pbVar12->m_floats + uVar11);
    iVar5 = iVar5 + 1;
  } while (iVar5 != svcount + (svcount == 0));
  fVar23 = local_b8[2] - local_a8[2];
  fVar37 = fVar23 * 0.5 + local_a8[2];
  fVar25 = (float)local_b8._0_8_ - (float)local_a8._0_8_;
  fVar27 = SUB84(local_b8._0_8_,4) - SUB84(local_a8._0_8_,4);
  fVar38 = fVar25 * 0.5 + (float)local_a8._0_8_;
  fVar39 = fVar27 * 0.5 + SUB84(local_a8._0_8_,4);
  uVar20 = -(uint)(fVar25 < 1e-06);
  uVar21 = -(uint)(fVar27 < 1e-06);
  if (svcount < 3) {
LAB_00127ff4:
    fVar29 = fVar25;
    if (3.4028235e+38 <= fVar25) {
      fVar29 = 3.4028235e+38;
    }
    fVar24 = (float)(~-(uint)(1e-06 < fVar25) & 0x7f7fffff | (uint)fVar29 & -(uint)(1e-06 < fVar25))
    ;
    fVar29 = fVar27;
    if (fVar24 <= fVar27) {
      fVar29 = fVar24;
    }
    fVar24 = (float)((uint)fVar29 & -(uint)(1e-06 < fVar27) |
                    ~-(uint)(1e-06 < fVar27) & (uint)fVar24);
    fVar29 = fVar23;
    if (fVar24 <= fVar23 || fVar23 <= 1e-06) {
      fVar29 = fVar24;
    }
    if ((fVar29 != 3.4028235e+38) || (NAN(fVar29))) {
      fVar29 = fVar29 * 0.05;
      uVar11 = CONCAT44(~uVar21 & (uint)fVar27,~uVar20 & (uint)fVar25) |
               CONCAT44((uint)fVar29 & uVar21,(uint)fVar29 & uVar20);
      if (1e-06 <= fVar23) {
        fVar29 = fVar23;
      }
    }
    else {
      uVar11 = 0x3c23d70a3c23d70a;
      fVar29 = 0.01;
    }
    fVar23 = fVar38 - (float)uVar11;
    fVar24 = (float)(uVar11 >> 0x20);
    fVar25 = fVar39 - fVar24;
    fVar27 = fVar37 - fVar29;
    fVar37 = fVar37 + fVar29;
    *(ulong *)local_98->m_floats = CONCAT44(fVar25,fVar23);
    local_98->m_floats[2] = fVar27;
    *local_90 = 1;
    local_98[1].m_floats[1] = fVar25;
    local_98[1].m_floats[2] = fVar27;
    *local_90 = 2;
    fVar38 = fVar38 + (float)uVar11;
    fVar39 = fVar39 + fVar24;
    local_98[1].m_floats[0] = fVar38;
    *(ulong *)local_98[2].m_floats = CONCAT44(fVar39,fVar38);
    local_98[2].m_floats[2] = fVar27;
    *local_90 = 3;
    local_98[3].m_floats[0] = fVar23;
    local_98[3].m_floats[1] = fVar39;
    local_98[3].m_floats[2] = fVar27;
    *local_90 = 4;
    *(ulong *)local_98[4].m_floats = CONCAT44(fVar25,fVar23);
    local_98[4].m_floats[2] = fVar37;
    *local_90 = 5;
    local_98[5].m_floats[0] = fVar38;
    local_98[5].m_floats[1] = fVar25;
    local_98[5].m_floats[2] = fVar37;
    *local_90 = 6;
    *(ulong *)local_98[6].m_floats = CONCAT44(fVar39,fVar38);
    local_98[6].m_floats[2] = fVar37;
    *local_90 = 7;
    local_98[7].m_floats[0] = fVar23;
    local_98[7].m_floats[1] = fVar39;
    local_98[7].m_floats[2] = fVar37;
  }
  else {
    auVar36._4_4_ = uVar20;
    auVar36._0_4_ = uVar20;
    auVar36._8_4_ = uVar21;
    auVar36._12_4_ = uVar21;
    uVar6 = movmskpd(iVar5,auVar36);
    if ((((uVar6 & 1) != 0) || ((byte)((byte)uVar6 >> 1) != 0)) || (fVar23 < 1e-06))
    goto LAB_00127ff4;
    *(ulong *)scale->m_floats = CONCAT44(fVar27,fVar25);
    scale->m_floats[2] = fVar23;
    auVar3._4_4_ = fVar27;
    auVar3._0_4_ = fVar25;
    auVar3._8_8_ = 0;
    auVar36 = divps(_DAT_001f53f0,auVar3);
    fVar38 = fVar38 * auVar36._0_4_;
    fVar39 = fVar39 * auVar36._4_4_;
    fStack_40 = auVar36._8_4_ * 0.0;
    fStack_3c = auVar36._12_4_ * 0.0;
    fVar37 = fVar37 * (1.0 / fVar23);
    pbVar16 = local_98->m_floats + 2;
    uVar20 = 0;
    puVar15 = local_90;
    pbVar9 = local_98;
    fVar25 = local_88;
    fVar27 = local_88;
    fVar29 = local_88;
    local_78 = pbVar16;
    local_70 = uVar11;
    local_68 = local_88;
    bStack_64 = local_88;
    bStack_60 = local_88;
    bStack_5c = local_88;
    local_58 = auVar36;
    local_48 = fVar38;
    fStack_44 = fVar39;
    do {
      fVar34 = (float)*(undefined8 *)svertices->m_floats * auVar36._0_4_;
      fVar35 = (float)((ulong)*(undefined8 *)svertices->m_floats >> 0x20) * auVar36._4_4_;
      fVar24 = svertices->m_floats[2] * (1.0 / fVar23);
      uVar21 = *puVar15;
      uVar7 = (ulong)uVar21;
      uVar18 = 0;
      if (uVar7 != 0) {
        fVar26 = fVar24 - fVar37;
        uVar17 = 0;
        pbVar10 = pbVar16;
        do {
          fVar31 = (float)*(undefined8 *)((btVector3 *)(pbVar10 + -2))->m_floats;
          fVar30 = (float)((ulong)*(undefined8 *)((btVector3 *)(pbVar10 + -2))->m_floats >> 0x20);
          iVar5 = -(uint)(fVar27 <= ABS(fVar31 - fVar34));
          iVar22 = -(uint)(fVar29 <= ABS(fVar30 - fVar35));
          auVar33._4_4_ = iVar22;
          auVar33._0_4_ = iVar5;
          auVar33._8_4_ = iVar22;
          auVar33._12_4_ = iVar22;
          auVar32._8_8_ = auVar33._8_8_;
          auVar32._4_4_ = iVar5;
          auVar32._0_4_ = iVar5;
          iVar5 = movmskpd((int)pbVar12,auVar32);
          bVar19 = iVar5 != 0;
          bVar4 = fVar25 <= ABS(*pbVar10 - fVar24);
          pbVar12 = (btVector3 *)(ulong)CONCAT31((int3)((uint)iVar5 >> 8),bVar4 || bVar19);
          if (!bVar4 && !bVar19) {
            fVar31 = fVar31 - fVar38;
            fVar30 = fVar30 - fVar39;
            fVar28 = *pbVar10 - fVar37;
            if (fVar28 * fVar28 + fVar31 * fVar31 + fVar30 * fVar30 <
                fVar26 * fVar26 +
                (fVar34 - fVar38) * (fVar34 - fVar38) + (fVar35 - fVar39) * (fVar35 - fVar39)) {
              *(ulong *)((btVector3 *)(pbVar10 + -2))->m_floats = CONCAT44(fVar35,fVar34);
              *pbVar10 = fVar24;
            }
            uVar18 = uVar17;
            if (!bVar4 && !bVar19) break;
          }
          uVar17 = uVar17 + 1;
          pbVar10 = pbVar10 + 4;
          uVar18 = uVar7;
        } while (uVar7 != uVar17);
      }
      if ((uint)uVar18 == uVar21) {
        *(ulong *)pbVar9[uVar7].m_floats = CONCAT44(fVar35,fVar34);
        pbVar9[uVar7].m_floats[2] = fVar24;
        *puVar15 = uVar21 + 1;
      }
      iVar5 = (this->m_vertexIndexMapping).m_size;
      iVar22 = (this->m_vertexIndexMapping).m_capacity;
      if (iVar5 == iVar22) {
        iVar13 = iVar5 * 2;
        if (iVar5 == 0) {
          iVar13 = 1;
        }
        if (iVar22 < iVar13) {
          if (iVar13 == 0) {
            piVar8 = (int *)0x0;
          }
          else {
            piVar8 = (int *)btAlignedAllocInternal((long)iVar13 << 2,0x10);
            pbVar12 = extraout_RDX;
          }
          pbVar9 = (btVector3 *)(long)(this->m_vertexIndexMapping).m_size;
          if (0 < (long)pbVar9) {
            piVar1 = (this->m_vertexIndexMapping).m_data;
            pbVar12 = (btVector3 *)0x0;
            do {
              piVar8[(long)pbVar12] = piVar1[(long)pbVar12];
              pbVar12 = (btVector3 *)((long)pbVar12->m_floats + 1);
            } while (pbVar9 != pbVar12);
          }
          piVar1 = (this->m_vertexIndexMapping).m_data;
          if (piVar1 != (int *)0x0) {
            if ((this->m_vertexIndexMapping).m_ownsMemory == true) {
              btAlignedFreeInternal(piVar1);
              pbVar12 = extraout_RDX_00;
            }
            (this->m_vertexIndexMapping).m_data = (int *)0x0;
          }
          (this->m_vertexIndexMapping).m_ownsMemory = true;
          (this->m_vertexIndexMapping).m_data = piVar8;
          (this->m_vertexIndexMapping).m_capacity = iVar13;
          puVar15 = local_90;
          pbVar9 = local_98;
          uVar11 = local_70;
          pbVar16 = local_78;
          fVar25 = local_88;
          auVar36 = local_58;
          fVar27 = local_68;
          fVar29 = bStack_64;
          fVar38 = local_48;
          fVar39 = fStack_44;
        }
      }
      (this->m_vertexIndexMapping).m_data[(this->m_vertexIndexMapping).m_size] = (uint)uVar18;
      piVar8 = &(this->m_vertexIndexMapping).m_size;
      *piVar8 = *piVar8 + 1;
      svertices = (btVector3 *)((long)svertices->m_floats + uVar11);
      uVar20 = uVar20 + 1;
    } while (uVar20 != svcount);
    local_c8[0] = 3.4028235e+38;
    local_c8[1] = 3.4028235e+38;
    local_c8[2] = 3.4028235e+38;
    local_d8[0] = -3.4028235e+38;
    local_d8[1] = -3.4028235e+38;
    local_d8[2] = -3.4028235e+38;
    uVar20 = *puVar15;
    if ((ulong)uVar20 != 0) {
      uVar11 = 0;
      pbVar12 = pbVar9;
      do {
        lVar14 = 0;
        do {
          fVar38 = pbVar12->m_floats[lVar14];
          if (fVar38 < local_c8[lVar14]) {
            local_c8[lVar14] = fVar38;
          }
          if (local_d8[lVar14] <= fVar38 && fVar38 != local_d8[lVar14]) {
            local_d8[lVar14] = fVar38;
          }
          lVar14 = lVar14 + 1;
        } while (lVar14 != 3);
        uVar11 = uVar11 + 1;
        pbVar12 = pbVar12 + 1;
      } while (uVar11 != uVar20);
    }
    local_d8[2] = local_d8[2] - local_c8[2];
    fVar38 = (float)local_d8._0_8_ - (float)local_c8._0_8_;
    fVar39 = SUB84(local_d8._0_8_,4) - SUB84(local_c8._0_8_,4);
    uVar21 = -(uint)(fVar38 < 1e-06);
    uVar6 = -(uint)(fVar39 < 1e-06);
    if (2 < uVar20) {
      auVar2._4_4_ = uVar21;
      auVar2._0_4_ = uVar21;
      auVar2._8_4_ = uVar6;
      auVar2._12_4_ = uVar6;
      uVar20 = movmskpd(uVar20,auVar2);
      if ((((uVar20 & 1) == 0) && ((byte)((byte)uVar20 >> 1) == 0)) && (1e-06 <= local_d8[2]))
      goto LAB_00128267;
    }
    fVar23 = fVar38;
    if (3.4028235e+38 <= fVar38) {
      fVar23 = 3.4028235e+38;
    }
    fVar25 = (float)(~-(uint)(1e-06 <= fVar38) & 0x7f7fffff |
                    (uint)fVar23 & -(uint)(1e-06 <= fVar38));
    fVar23 = fVar39;
    if (fVar25 <= fVar39) {
      fVar23 = fVar25;
    }
    fVar23 = (float)((uint)fVar23 & -(uint)(1e-06 <= fVar39) |
                    ~-(uint)(1e-06 <= fVar39) & (uint)fVar25);
    fVar25 = local_d8[2];
    if (fVar23 <= local_d8[2] || local_d8[2] < 1e-06) {
      fVar25 = fVar23;
    }
    fVar23 = fVar38 * 0.5 + (float)local_c8._0_8_;
    fVar27 = fVar39 * 0.5 + SUB84(local_c8._0_8_,4);
    local_c8[2] = local_d8[2] * 0.5 + local_c8[2];
    if ((fVar25 != 3.4028235e+38) || (NAN(fVar25))) {
      fVar25 = fVar25 * 0.05;
      uVar11 = CONCAT44(~uVar6 & (uint)fVar39,~uVar21 & (uint)fVar38) |
               CONCAT44((uint)fVar25 & uVar6,(uint)fVar25 & uVar21);
      if (1e-06 <= local_d8[2]) {
        fVar25 = local_d8[2];
      }
    }
    else {
      uVar11 = 0x3c23d70a3c23d70a;
      fVar25 = 0.01;
    }
    fVar39 = fVar23 - (float)uVar11;
    fVar38 = (float)(uVar11 >> 0x20);
    fVar37 = fVar27 - fVar38;
    fVar29 = local_c8[2] - fVar25;
    local_c8[2] = local_c8[2] + fVar25;
    *puVar15 = 0;
    *(ulong *)pbVar9->m_floats = CONCAT44(fVar37,fVar39);
    pbVar9->m_floats[2] = fVar29;
    *puVar15 = 1;
    pbVar9[1].m_floats[1] = fVar37;
    pbVar9[1].m_floats[2] = fVar29;
    *puVar15 = 2;
    fVar23 = fVar23 + (float)uVar11;
    fVar27 = fVar27 + fVar38;
    pbVar9[1].m_floats[0] = fVar23;
    *(ulong *)pbVar9[2].m_floats = CONCAT44(fVar27,fVar23);
    pbVar9[2].m_floats[2] = fVar29;
    *puVar15 = 3;
    pbVar9[3].m_floats[0] = fVar39;
    pbVar9[3].m_floats[1] = fVar27;
    pbVar9[3].m_floats[2] = fVar29;
    *puVar15 = 4;
    *(ulong *)pbVar9[4].m_floats = CONCAT44(fVar37,fVar39);
    pbVar9[4].m_floats[2] = local_c8[2];
    *puVar15 = 5;
    pbVar9[5].m_floats[0] = fVar23;
    pbVar9[5].m_floats[1] = fVar37;
    pbVar9[5].m_floats[2] = local_c8[2];
    *puVar15 = 6;
    *(ulong *)pbVar9[6].m_floats = CONCAT44(fVar27,fVar23);
    pbVar9[6].m_floats[2] = local_c8[2];
    *puVar15 = 7;
    pbVar9[7].m_floats[0] = fVar39;
    pbVar9[7].m_floats[1] = fVar27;
    pbVar9[7].m_floats[2] = local_c8[2];
    local_90 = puVar15;
  }
  *local_90 = 8;
LAB_00128267:
  return svcount != 0;
}

Assistant:

bool  HullLibrary::CleanupVertices(unsigned int svcount,
				   const btVector3 *svertices,
				   unsigned int stride,
				   unsigned int &vcount,       // output number of vertices
				   btVector3 *vertices,                 // location to store the results.
				   btScalar  normalepsilon,
				   btVector3& scale)
{
	if ( svcount == 0 ) return false;

	m_vertexIndexMapping.resize(0);


#define EPSILON btScalar(0.000001) /* close enough to consider two btScalaring point numbers to be 'the same'. */

	vcount = 0;

	btScalar recip[3]={0.f,0.f,0.f};

	if ( scale )
	{
		scale[0] = 1;
		scale[1] = 1;
		scale[2] = 1;
	}

	btScalar bmin[3] = {  FLT_MAX,  FLT_MAX,  FLT_MAX };
	btScalar bmax[3] = { -FLT_MAX, -FLT_MAX, -FLT_MAX };

	const char *vtx = (const char *) svertices;

//	if ( 1 )
	{
		for (unsigned int i=0; i<svcount; i++)
		{
			const btScalar *p = (const btScalar *) vtx;

			vtx+=stride;

			for (int j=0; j<3; j++)
			{
				if ( p[j] < bmin[j] ) bmin[j] = p[j];
				if ( p[j] > bmax[j] ) bmax[j] = p[j];
			}
		}
	}

	btScalar dx = bmax[0] - bmin[0];
	btScalar dy = bmax[1] - bmin[1];
	btScalar dz = bmax[2] - bmin[2];

	btVector3 center;

	center[0] = dx*btScalar(0.5) + bmin[0];
	center[1] = dy*btScalar(0.5) + bmin[1];
	center[2] = dz*btScalar(0.5) + bmin[2];

	if ( dx < EPSILON || dy < EPSILON || dz < EPSILON || svcount < 3 )
	{

		btScalar len = FLT_MAX;

		if ( dx > EPSILON && dx < len ) len = dx;
		if ( dy > EPSILON && dy < len ) len = dy;
		if ( dz > EPSILON && dz < len ) len = dz;

		if ( len == FLT_MAX )
		{
			dx = dy = dz = btScalar(0.01); // one centimeter
		}
		else
		{
			if ( dx < EPSILON ) dx = len * btScalar(0.05); // 1/5th the shortest non-zero edge.
			if ( dy < EPSILON ) dy = len * btScalar(0.05);
			if ( dz < EPSILON ) dz = len * btScalar(0.05);
		}

		btScalar x1 = center[0] - dx;
		btScalar x2 = center[0] + dx;

		btScalar y1 = center[1] - dy;
		btScalar y2 = center[1] + dy;

		btScalar z1 = center[2] - dz;
		btScalar z2 = center[2] + dz;

		addPoint(vcount,vertices,x1,y1,z1);
		addPoint(vcount,vertices,x2,y1,z1);
		addPoint(vcount,vertices,x2,y2,z1);
		addPoint(vcount,vertices,x1,y2,z1);
		addPoint(vcount,vertices,x1,y1,z2);
		addPoint(vcount,vertices,x2,y1,z2);
		addPoint(vcount,vertices,x2,y2,z2);
		addPoint(vcount,vertices,x1,y2,z2);

		return true; // return cube


	}
	else
	{
		if ( scale )
		{
			scale[0] = dx;
			scale[1] = dy;
			scale[2] = dz;

			recip[0] = 1 / dx;
			recip[1] = 1 / dy;
			recip[2] = 1 / dz;

			center[0]*=recip[0];
			center[1]*=recip[1];
			center[2]*=recip[2];

		}

	}



	vtx = (const char *) svertices;

	for (unsigned int i=0; i<svcount; i++)
	{
		const btVector3 *p = (const btVector3 *)vtx;
		vtx+=stride;

		btScalar px = p->getX();
		btScalar py = p->getY();
		btScalar pz = p->getZ();

		if ( scale )
		{
			px = px*recip[0]; // normalize
			py = py*recip[1]; // normalize
			pz = pz*recip[2]; // normalize
		}

//		if ( 1 )
		{
			unsigned int j;

			for (j=0; j<vcount; j++)
			{
				/// XXX might be broken
				btVector3& v = vertices[j];

				btScalar x = v[0];
				btScalar y = v[1];
				btScalar z = v[2];

				btScalar dx = btFabs(x - px );
				btScalar dy = btFabs(y - py );
				btScalar dz = btFabs(z - pz );

				if ( dx < normalepsilon && dy < normalepsilon && dz < normalepsilon )
				{
					// ok, it is close enough to the old one
					// now let us see if it is further from the center of the point cloud than the one we already recorded.
					// in which case we keep this one instead.

					btScalar dist1 = GetDist(px,py,pz,center);
					btScalar dist2 = GetDist(v[0],v[1],v[2],center);

					if ( dist1 > dist2 )
					{
						v[0] = px;
						v[1] = py;
						v[2] = pz;
						
					}

					break;
				}
			}

			if ( j == vcount )
			{
				btVector3& dest = vertices[vcount];
				dest[0] = px;
				dest[1] = py;
				dest[2] = pz;
				vcount++;
			}
			m_vertexIndexMapping.push_back(j);
		}
	}

	// ok..now make sure we didn't prune so many vertices it is now invalid.
//	if ( 1 )
	{
		btScalar bmin[3] = {  FLT_MAX,  FLT_MAX,  FLT_MAX };
		btScalar bmax[3] = { -FLT_MAX, -FLT_MAX, -FLT_MAX };

		for (unsigned int i=0; i<vcount; i++)
		{
			const btVector3& p = vertices[i];
			for (int j=0; j<3; j++)
			{
				if ( p[j] < bmin[j] ) bmin[j] = p[j];
				if ( p[j] > bmax[j] ) bmax[j] = p[j];
			}
		}

		btScalar dx = bmax[0] - bmin[0];
		btScalar dy = bmax[1] - bmin[1];
		btScalar dz = bmax[2] - bmin[2];

		if ( dx < EPSILON || dy < EPSILON || dz < EPSILON || vcount < 3)
		{
			btScalar cx = dx*btScalar(0.5) + bmin[0];
			btScalar cy = dy*btScalar(0.5) + bmin[1];
			btScalar cz = dz*btScalar(0.5) + bmin[2];

			btScalar len = FLT_MAX;

			if ( dx >= EPSILON && dx < len ) len = dx;
			if ( dy >= EPSILON && dy < len ) len = dy;
			if ( dz >= EPSILON && dz < len ) len = dz;

			if ( len == FLT_MAX )
			{
				dx = dy = dz = btScalar(0.01); // one centimeter
			}
			else
			{
				if ( dx < EPSILON ) dx = len * btScalar(0.05); // 1/5th the shortest non-zero edge.
				if ( dy < EPSILON ) dy = len * btScalar(0.05);
				if ( dz < EPSILON ) dz = len * btScalar(0.05);
			}

			btScalar x1 = cx - dx;
			btScalar x2 = cx + dx;

			btScalar y1 = cy - dy;
			btScalar y2 = cy + dy;

			btScalar z1 = cz - dz;
			btScalar z2 = cz + dz;

			vcount = 0; // add box

			addPoint(vcount,vertices,x1,y1,z1);
			addPoint(vcount,vertices,x2,y1,z1);
			addPoint(vcount,vertices,x2,y2,z1);
			addPoint(vcount,vertices,x1,y2,z1);
			addPoint(vcount,vertices,x1,y1,z2);
			addPoint(vcount,vertices,x2,y1,z2);
			addPoint(vcount,vertices,x2,y2,z2);
			addPoint(vcount,vertices,x1,y2,z2);

			return true;
		}
	}

	return true;
}